

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

void unshuffle64(LONGLONG *a,int n,int n2,LONGLONG *tmp)

{
  int iVar1;
  LONGLONG *pLVar2;
  LONGLONG *pLVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = n + 1 >> 1;
  pLVar2 = a + iVar1 * n2;
  lVar4 = (long)n2;
  pLVar3 = tmp;
  for (iVar5 = iVar1; iVar5 < n; iVar5 = iVar5 + 1) {
    *pLVar3 = *pLVar2;
    pLVar3 = pLVar3 + 1;
    pLVar2 = pLVar2 + lVar4;
  }
  iVar1 = iVar1 + -1;
  pLVar2 = a + iVar1 * n2;
  pLVar3 = a + iVar1 * n2 * 2;
  for (; -1 < iVar1; iVar1 = iVar1 + -1) {
    *pLVar3 = *pLVar2;
    pLVar3 = pLVar3 + -(long)(n2 * 2);
    pLVar2 = pLVar2 + -lVar4;
  }
  pLVar2 = a + lVar4;
  for (lVar4 = 0; (int)lVar4 + 1 < n; lVar4 = lVar4 + 2) {
    *pLVar2 = *(LONGLONG *)((long)tmp + lVar4 * 4);
    pLVar2 = pLVar2 + n2 * 2;
  }
  return;
}

Assistant:

static void
unshuffle64(LONGLONG a[], int n, int n2, LONGLONG tmp[])
/*
LONGLONG a[];	 array to shuffle					
int n;		 number of elements to shuffle	
int n2;		 second dimension					
LONGLONG tmp[];	 scratch storage					
*/
{
int i;
int nhalf;
LONGLONG *p1, *p2, *pt;
 
	/*
	 * copy 2nd half of array to tmp
	 */
	nhalf = (n+1)>>1;
	pt = tmp;
	p1 = &a[n2*nhalf];				/* pointer to a[i]			*/
	for (i=nhalf; i<n; i++) {
		*pt = *p1;
		p1 += n2;
		pt += 1;
	}
	/*
	 * distribute 1st half of array to even elements
	 */
	p2 = &a[ n2*(nhalf-1) ];		/* pointer to a[i]			*/
	p1 = &a[(n2*(nhalf-1))<<1];		/* pointer to a[2*i]		*/
	for (i=nhalf-1; i >= 0; i--) {
		*p1 = *p2;
		p2 -= n2;
		p1 -= (n2+n2);
	}
	/*
	 * now distribute 2nd half of array (in tmp) to odd elements
	 */
	pt = tmp;
	p1 = &a[n2];					/* pointer to a[i]			*/
	for (i=1; i<n; i += 2) {
		*p1 = *pt;
		p1 += (n2+n2);
		pt += 1;
	}
}